

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_kmgmt.c
# Opt level: O0

int dsa_key_todata(DSA *dsa,OSSL_PARAM_BLD *bld,OSSL_PARAM *params)

{
  int iVar1;
  DSA *in_RDI;
  BIGNUM *pub;
  BIGNUM *priv;
  char *in_stack_ffffffffffffffc8;
  OSSL_PARAM *p;
  BIGNUM *bld_00;
  int local_4;
  
  bld_00 = (BIGNUM *)0x0;
  p = (OSSL_PARAM *)0x0;
  if (in_RDI == (DSA *)0x0) {
    local_4 = 0;
  }
  else {
    DSA_get0_key(in_RDI,(BIGNUM **)&stack0xffffffffffffffd0,(BIGNUM **)&stack0xffffffffffffffd8);
    if ((bld_00 != (BIGNUM *)0x0) &&
       (iVar1 = ossl_param_build_set_bn
                          ((OSSL_PARAM_BLD *)bld_00,p,in_stack_ffffffffffffffc8,(BIGNUM *)0x332ec1),
       iVar1 == 0)) {
      return 0;
    }
    if ((p != (OSSL_PARAM *)0x0) &&
       (iVar1 = ossl_param_build_set_bn
                          ((OSSL_PARAM_BLD *)bld_00,p,in_stack_ffffffffffffffc8,(BIGNUM *)0x332ef3),
       iVar1 == 0)) {
      return 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int dsa_key_todata(DSA *dsa, OSSL_PARAM_BLD *bld, OSSL_PARAM params[])
{
    const BIGNUM *priv = NULL, *pub = NULL;

    if (dsa == NULL)
        return 0;

    DSA_get0_key(dsa, &pub, &priv);
    if (priv != NULL
        && !ossl_param_build_set_bn(bld, params, OSSL_PKEY_PARAM_PRIV_KEY, priv))
        return 0;
    if (pub != NULL
        && !ossl_param_build_set_bn(bld, params, OSSL_PKEY_PARAM_PUB_KEY, pub))
        return 0;

    return 1;
}